

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *os,half4 *v)

{
  float fVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  fVar1 = tinyusdz::value::half_to_float((half)v->_M_elems[0].value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)v->_M_elems[1].value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)v->_M_elems[2].value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)v->_M_elems[3].value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::half4 &v) {
  os << "(" << v[0] << ", " << v[1] << ", " << v[2] << ", " << v[3] << ")";
  return os;
}